

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall
QSharedDataPointer<QProcessEnvironmentPrivate>::~QSharedDataPointer
          (QSharedDataPointer<QProcessEnvironmentPrivate> *this)

{
  QProcessEnvironmentPrivate *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QProcessEnvironmentPrivate *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type_conflict)
         (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int> == 0) &&
       (pQVar1 = (this->d).ptr, pQVar1 != (QProcessEnvironmentPrivate *)0x0)) {
      QMutex::~QMutex(&pQVar1->nameMapMutex);
      QHash<QString,_QByteArray>::~QHash(&pQVar1->nameMap);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&(pQVar1->vars).d);
      operator_delete(pQVar1,0x20);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }